

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O1

Var Js::CrossSite::CommonThunk
              (RecyclableObject *recyclableObject,JavascriptMethod entryPoint,Arguments *args)

{
  byte *pbVar1;
  ScriptContext *scriptContext;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  HRESULT hr;
  DynamicObject *pDVar7;
  JavascriptFunction *pJVar8;
  undefined4 *puVar9;
  Var pvVar10;
  FrameDisplay *display;
  CheckCodeGenFunction p_Var11;
  ScriptFunction *pSVar12;
  JavascriptMethod p_Var13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  anon_class_48_6_9e8417c9 local_d8;
  Arguments local_a8;
  Arguments local_98;
  FinallyObject local_88;
  IUnknown *local_78;
  IUnknown *sourceCaller;
  IUnknown *previousSourceCaller;
  BOOL wasDispatchExCallerPushed;
  BOOL wasCallerSet;
  HostScriptContext *callerHostScriptContext;
  JavascriptMethod local_50;
  HostScriptContext *local_48;
  HostScriptContext *calleeHostScriptContext;
  bool local_31;
  
  local_50 = entryPoint;
  pDVar7 = VarTo<Js::DynamicObject,Js::RecyclableObject>(recyclableObject);
  bVar4 = VarIsImpl<Js::JavascriptFunction>(&pDVar7->super_RecyclableObject);
  if (bVar4) {
    pJVar8 = VarTo<Js::JavascriptFunction,Js::DynamicObject>(pDVar7);
    callerHostScriptContext = (HostScriptContext *)(pJVar8->functionInfo).ptr;
  }
  else {
    callerHostScriptContext = (HostScriptContext *)0x0;
  }
  if ((FunctionInfo *)callerHostScriptContext == (FunctionInfo *)0x0) {
    local_31 = true;
  }
  else {
    local_31 = (((FunctionInfo *)callerHostScriptContext)->attributes >> 0x13 & 1) == 0;
    ((FunctionInfo *)callerHostScriptContext)->attributes =
         ((FunctionInfo *)callerHostScriptContext)->attributes & ~CanDefer;
  }
  scriptContext =
       (((((pDVar7->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  iVar5 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(scriptContext);
  if ((char)iVar5 != '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1d0,"(!targetScriptContext->IsClosed())",
                                "!targetScriptContext->IsClosed()");
    if (!bVar4) goto LAB_007620f9;
    *puVar9 = 0;
  }
  BVar6 = RecyclableObject::IsExternal(&pDVar7->super_RecyclableObject);
  if (BVar6 == 0) {
    iVar5 = (*(pDVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x66])(pDVar7);
    if (iVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x1d1,"(function->IsExternal() || function->IsCrossSiteObject())"
                                  ,"function->IsExternal() || function->IsCrossSiteObject()");
      if (!bVar4) goto LAB_007620f9;
      *puVar9 = 0;
    }
  }
  if (scriptContext->threadContext->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1d2,"(targetScriptContext->GetThreadContext()->IsScriptActive())"
                                ,"targetScriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar4) goto LAB_007620f9;
    *puVar9 = 0;
  }
  local_48 = scriptContext->hostScriptContext;
  _wasDispatchExCallerPushed =
       ThreadContext::GetPreviousHostScriptContext(scriptContext->threadContext);
  if (_wasDispatchExCallerPushed == local_48) {
LAB_00761e75:
    pTVar2 = scriptContext->threadContext;
    bVar4 = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    local_98.Info = args->Info;
    local_98.Values = args->Values;
    pvVar10 = JavascriptFunction::CallFunction<true>
                        (&pDVar7->super_RecyclableObject,local_50,&local_98,true);
    pTVar2->reentrancySafeOrHandled = bVar4;
    goto LAB_007620d6;
  }
  if (_wasDispatchExCallerPushed == (HostScriptContext *)0x0) {
    iVar5 = (*local_48->_vptr_HostScriptContext[10])();
    if (iVar5 == 0) goto LAB_00761e75;
  }
  (*local_48->_vptr_HostScriptContext[0x19])(local_48,_wasDispatchExCallerPushed->scriptContext);
  uVar15 = 0;
  calleeHostScriptContext = (HostScriptContext *)pDVar7;
  if (*args->Values == (void *)0x0) {
    if (((args->Info).field_0x3 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x1ea,"(args.IsNewCall())","args.IsNewCall()");
      if (!bVar4) goto LAB_007620f9;
      *puVar9 = 0;
    }
    bVar4 = VarIs<Js::JavascriptProxy,Js::DynamicObject>((DynamicObject *)calleeHostScriptContext);
    uVar15 = 1;
    if (!bVar4) {
      bVar4 = VarIsImpl<Js::JavascriptFunction>((RecyclableObject *)calleeHostScriptContext);
      if (bVar4) {
        pJVar8 = VarTo<Js::JavascriptFunction,Js::DynamicObject>
                           ((DynamicObject *)calleeHostScriptContext);
        if ((((pJVar8->functionInfo).ptr)->attributes & SkipDefaultNewObject) != None)
        goto LAB_00761e03;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x1eb,
                                  "(VarIs<JavascriptProxy>(function) || (VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo()->GetAttributes() & FunctionInfo::SkipDefaultNewObject))"
                                  ,
                                  "VarIs<JavascriptProxy>(function) || (VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo()->GetAttributes() & FunctionInfo::SkipDefaultNewObject)"
                                 );
      if (!bVar4) goto LAB_007620f9;
      *puVar9 = 0;
    }
  }
LAB_00761e03:
  uVar14 = SUB84(args->Info,0);
  if (uVar15 < (uVar14 & 0xffffff)) {
    uVar16 = (ulong)uVar15;
    do {
      pvVar10 = MarshalVar(scriptContext,args->Values[uVar16],false);
      args->Values[uVar16] = pvVar10;
      uVar16 = uVar16 + 1;
    } while ((uVar14 & 0xffffff) != uVar16);
  }
  uVar15 = *(uint *)&args->Info;
  if ((uVar15 >> 0x1e & 1) == 0) {
    bVar4 = CallInfo::HasExtraArg(uVar15 >> 0x18);
    pDVar7 = (DynamicObject *)calleeHostScriptContext;
    if (bVar4) {
      display = Arguments::GetFrameDisplay(args);
      pvVar10 = MarshalFrameDisplay(scriptContext,display);
      goto LAB_00761ee1;
    }
  }
  else {
    pvVar10 = CallInfo::GetNewTarget(uVar15 >> 0x18,args->Values,uVar15 & 0xffffff);
    pDVar7 = (DynamicObject *)calleeHostScriptContext;
    pvVar10 = MarshalVar(scriptContext,pvVar10,false);
LAB_00761ee1:
    args->Values[uVar14 & 0xffffff] = pvVar10;
  }
  p_Var11 = GetCheckCodeGenFunction(local_50);
  if (p_Var11 != (CheckCodeGenFunction)0x0) {
    pSVar12 = VarTo<Js::ScriptFunction,Js::DynamicObject>(pDVar7);
    local_50 = (*p_Var11)(pSVar12);
    p_Var13 = RecyclableObject::GetEntryPoint(&pDVar7->super_RecyclableObject);
    if (p_Var13 != DefaultThunk && p_Var13 != ProfileThunk) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x204,"(CrossSite::IsThunk(function->GetEntryPoint()))",
                                  "CrossSite::IsThunk(function->GetEntryPoint())");
      if (!bVar4) goto LAB_007620f9;
      *puVar9 = 0;
    }
  }
  local_d8.sourceCaller = &local_78;
  local_78 = (IUnknown *)0x0;
  local_d8.previousSourceCaller = &sourceCaller;
  sourceCaller = (IUnknown *)0x0;
  local_d8.wasDispatchExCallerPushed = (BOOL *)&previousSourceCaller;
  previousSourceCaller._0_4_ = 0;
  local_d8.wasCallerSet = (BOOL *)((long)&previousSourceCaller + 4);
  previousSourceCaller._4_4_ = 0;
  local_88.finallyFunc = &local_d8;
  local_d8.callerHostScriptContext = (HostScriptContext **)&wasDispatchExCallerPushed;
  local_d8.calleeHostScriptContext = &local_48;
  local_88.abnormalTermination = true;
  hr = (*_wasDispatchExCallerPushed->_vptr_HostScriptContext[5])();
  if (-1 < hr) {
    hr = (*local_48->_vptr_HostScriptContext[4])(local_48,local_78,&sourceCaller);
  }
  if (-1 < hr) {
    previousSourceCaller._4_4_ = 1;
    hr = (*local_48->_vptr_HostScriptContext[2])();
  }
  if (hr < 0) {
    JavascriptError::MapAndThrowError(scriptContext,hr);
  }
  previousSourceCaller._0_4_ = 1;
  pTVar2 = scriptContext->threadContext;
  bVar4 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  local_a8.Info = args->Info;
  local_a8.Values = args->Values;
  pvVar10 = JavascriptFunction::CallFunction<true>
                      ((RecyclableObject *)calleeHostScriptContext,local_50,&local_a8,true);
  pTVar2->reentrancySafeOrHandled = bVar4;
  pvVar10 = MarshalVar(_wasDispatchExCallerPushed->scriptContext,pvVar10,false);
  local_88.abnormalTermination = false;
  anon_func::FinallyObject::~FinallyObject(&local_88);
  if (pvVar10 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x24a,"(result != nullptr)","result != nullptr");
    if (!bVar4) {
LAB_007620f9:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
LAB_007620d6:
  if (local_31 == false) {
    pbVar1 = (byte *)((long)&callerHostScriptContext[1].scriptContext + 2);
    *pbVar1 = *pbVar1 | 8;
  }
  return pvVar10;
}

Assistant:

Var CrossSite::CommonThunk(RecyclableObject* recyclableObject, JavascriptMethod entryPoint, Arguments args)
    {
        DynamicObject* function = VarTo<DynamicObject>(recyclableObject);

        FunctionInfo * functionInfo = (VarIs<JavascriptFunction>(function) ? VarTo<JavascriptFunction>(function)->GetFunctionInfo() : nullptr);
        AutoDisableRedeferral autoDisableRedeferral(functionInfo);

        ScriptContext* targetScriptContext = function->GetScriptContext();
        Assert(!targetScriptContext->IsClosed());
        Assert(function->IsExternal() || function->IsCrossSiteObject());
        Assert(targetScriptContext->GetThreadContext()->IsScriptActive());

        HostScriptContext* calleeHostScriptContext = targetScriptContext->GetHostScriptContext();
        HostScriptContext* callerHostScriptContext = targetScriptContext->GetThreadContext()->GetPreviousHostScriptContext();

        if (callerHostScriptContext == calleeHostScriptContext || (callerHostScriptContext == nullptr && !calleeHostScriptContext->HasCaller()))
        {
            BEGIN_SAFE_REENTRANT_CALL(targetScriptContext->GetThreadContext())
            {
                return JavascriptFunction::CallFunction<true>(function, entryPoint, args, true /*useLargeArgCount*/);
            }
            END_SAFE_REENTRANT_CALL
        }

#if DBG_DUMP || defined(PROFILE_EXEC) || defined(PROFILE_MEM)
        calleeHostScriptContext->EnsureParentInfo(callerHostScriptContext->GetScriptContext());
#endif

        TTD_XSITE_LOG(recyclableObject->GetScriptContext(), "CommonThunk -- Pass Through", recyclableObject);

        uint i = 0;
        if (args.Values[0] == nullptr)
        {
            i = 1;
            Assert(args.IsNewCall());
            Assert(VarIs<JavascriptProxy>(function) || (VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo()->GetAttributes() & FunctionInfo::SkipDefaultNewObject));
        }
        uint count = args.Info.Count;
        for (; i < count; i++)
        {
            args.Values[i] = CrossSite::MarshalVar(targetScriptContext, args.Values[i]);
        }
        if (args.HasNewTarget())
        {
            // Last value is new.target
            args.Values[count] = CrossSite::MarshalVar(targetScriptContext, args.GetNewTarget());
        }
        else if (args.HasExtraArg())
        {
            // The final eval arg is a frame display that needs to be marshaled specially.
            args.Values[count] = CrossSite::MarshalFrameDisplay(targetScriptContext, args.GetFrameDisplay());
        }


#if ENABLE_NATIVE_CODEGEN
        CheckCodeGenFunction checkCodeGenFunction = GetCheckCodeGenFunction(entryPoint);
        if (checkCodeGenFunction != nullptr)
        {
            ScriptFunction* callFunc = VarTo<ScriptFunction>(function);
            entryPoint = checkCodeGenFunction(callFunc);
            Assert(CrossSite::IsThunk(function->GetEntryPoint()));
        }
#endif

        // We need to setup the caller chain when we go across script site boundary. Property access
        // is OK, and we need to let host know who the caller is when a call is from another script site.
        // CrossSiteObject is the natural place but it is in the target site. We build up the site
        // chain through PushDispatchExCaller/PopDispatchExCaller, and we call SetCaller in the target site
        // to indicate who the caller is. We first need to get the site from the previously pushed site
        // and set that as the caller for current call, and push a new DispatchExCaller for future calls
        // off this site. GetDispatchExCaller and ReleaseDispatchExCaller is used to get the current caller.
        // currentDispatchExCaller is cached to avoid multiple allocations.
        IUnknown* sourceCaller = nullptr, *previousSourceCaller = nullptr;
        HRESULT hr = NOERROR;
        Var result = nullptr;
        BOOL wasDispatchExCallerPushed = FALSE, wasCallerSet = FALSE;

        TryFinally([&]()
        {
            hr = callerHostScriptContext->GetDispatchExCaller((void**)&sourceCaller);

            if (SUCCEEDED(hr))
            {
                hr = calleeHostScriptContext->SetCaller((IUnknown*)sourceCaller, (IUnknown**)&previousSourceCaller);
            }

            if (SUCCEEDED(hr))
            {
                wasCallerSet = TRUE;
                hr = calleeHostScriptContext->PushHostScriptContext();
            }
            if (FAILED(hr))
            {
                // CONSIDER: Should this be callerScriptContext if we failed?
                JavascriptError::MapAndThrowError(targetScriptContext, hr);
            }
            wasDispatchExCallerPushed = TRUE;

            BEGIN_SAFE_REENTRANT_CALL(targetScriptContext->GetThreadContext())
            {
                result = JavascriptFunction::CallFunction<true>(function, entryPoint, args, true /*useLargeArgCount*/);
            }
            END_SAFE_REENTRANT_CALL
            ScriptContext* callerScriptContext = callerHostScriptContext->GetScriptContext();
            result = CrossSite::MarshalVar(callerScriptContext, result);
        },
        [&](bool hasException)
        {
            if (sourceCaller != nullptr)
            {
                callerHostScriptContext->ReleaseDispatchExCaller(sourceCaller);
            }
            IUnknown* originalCaller = nullptr;
            if (wasDispatchExCallerPushed)
            {
                calleeHostScriptContext->PopHostScriptContext();
            }
            if (wasCallerSet)
            {
                calleeHostScriptContext->SetCaller(previousSourceCaller, &originalCaller);
                if (previousSourceCaller)
                {
                    previousSourceCaller->Release();
                }
                if (originalCaller)
                {
                    originalCaller->Release();
                }
            }
        });
        Assert(result != nullptr);
        return result;
    }